

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

status asio::detail::
       reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
       ::do_perform(reactor_op *base)

{
  state_type state;
  socket_type s;
  bool bVar1;
  size_t *local_40;
  socket_addr_type *local_30;
  socket_type local_1c;
  status result;
  socket_type new_socket;
  reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  *o;
  reactor_op *base_local;
  
  local_1c = -1;
  s = *(socket_type *)&base[1].super_operation.next_;
  state = *(state_type *)((long)&base[1].super_operation.next_ + 4);
  _result = base;
  o = (reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
       *)base;
  if (base[1].ec_._M_cat == (error_category *)0x0) {
    local_30 = (socket_addr_type *)0x0;
  }
  else {
    local_30 = ip::basic_endpoint<asio::ip::tcp>::data
                         ((basic_endpoint<asio::ip::tcp> *)base[1].ec_._M_cat);
  }
  if (_result[1].ec_._M_cat == (error_category *)0x0) {
    local_40 = (size_t *)0x0;
  }
  else {
    local_40 = &_result[1].bytes_transferred_;
  }
  bVar1 = socket_ops::non_blocking_accept(s,state,local_30,local_40,&_result->ec_,&local_1c);
  socket_holder::reset((socket_holder *)&_result[1].super_operation.func_,local_1c);
  return (uint)bVar1;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_accept_op_base* o(
        static_cast<reactive_socket_accept_op_base*>(base));

    socket_type new_socket = invalid_socket;
    status result = socket_ops::non_blocking_accept(o->socket_,
        o->state_, o->peer_endpoint_ ? o->peer_endpoint_->data() : 0,
        o->peer_endpoint_ ? &o->addrlen_ : 0, o->ec_, new_socket)
    ? done : not_done;
    o->new_socket_.reset(new_socket);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_accept", o->ec_));

    return result;
  }